

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opbehavior.cc
# Opt level: O2

uintb __thiscall
OpBehaviorIntSlessEqual::evaluateBinary
          (OpBehaviorIntSlessEqual *this,int4 sizeout,int4 sizein,uintb in1,uintb in2)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  if (sizein < 1) {
    bVar3 = false;
  }
  else {
    uVar2 = 0x80L << ((char)(sizein << 3) - 8U & 0x3f);
    uVar1 = uVar2 & in1;
    if (uVar1 == (uVar2 & in2)) {
      bVar3 = in1 <= in2;
    }
    else {
      bVar3 = uVar1 != 0;
    }
  }
  return (ulong)bVar3;
}

Assistant:

uintb OpBehaviorIntSlessEqual::evaluateBinary(int4 sizeout,int4 sizein,uintb in1,uintb in2) const

{
  uintb res,mask,bit1,bit2;

  if (sizein<=0)
    res = 0;
  else {
    mask = 0x80;
    mask <<= 8*(sizein-1);
    bit1 = in1 & mask;		// Get the sign bits
    bit2 = in2 & mask;
    if (bit1 != bit2)
      res = (bit1 != 0) ? 1 : 0;
    else
      res = (in1 <= in2) ? 1 : 0;
  }
  return res;
}